

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemdelegate.cpp
# Opt level: O2

bool __thiscall
QAbstractItemDelegatePrivate::handleEditorEvent
          (QAbstractItemDelegatePrivate *this,QObject *object,QEvent *event)

{
  short sVar1;
  QAbstractItemDelegate *this_00;
  char cVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  QTextEdit *pQVar6;
  QPlainTextEdit *pQVar7;
  QWidget *pQVar8;
  QAbstractItemDelegatePrivate *pQVar9;
  long lVar10;
  EndEditHint _t2;
  QEvent *this_01;
  QAbstractItemDelegatePrivate *this_02;
  long in_FS_OFFSET;
  QMetaMethodArgument local_50;
  QWidget *editor;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((object == (QObject *)0x0) || ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) == 0))
  goto LAB_004ded42;
  this_00 = *(QAbstractItemDelegate **)&this->field_0x8;
  sVar1 = *(short *)(event + 8);
  editor = (QWidget *)object;
  if (sVar1 == 0x33) {
    cVar2 = QKeyEvent::matches((StandardKey)event);
    if (cVar2 == '\0') goto LAB_004ded42;
    event[0xc] = (QEvent)0x1;
LAB_004dee3f:
    bVar3 = true;
    goto LAB_004ded44;
  }
  if (sVar1 == 9) {
LAB_004dedf0:
    bVar3 = QWidget::isActiveWindow((QWidget *)object);
    if (bVar3) {
      pQVar8 = QApplication::focusWidget();
      if (pQVar8 == (QWidget *)object) goto LAB_004ded42;
    }
    for (pQVar8 = QApplication::focusWidget(); pQVar8 != (QWidget *)0x0;
        pQVar8 = *(QWidget **)(*(long *)&pQVar8->field_0x8 + 0x10)) {
      if (pQVar8 == (QWidget *)object) goto LAB_004ded42;
    }
    this_02 = QGuiApplicationPrivate::platform_integration;
    pQVar9 = (QAbstractItemDelegatePrivate *)
             (**(code **)(*(long *)QGuiApplicationPrivate::platform_integration + 0x78))();
    if (pQVar9 != (QAbstractItemDelegatePrivate *)0x0) {
      lVar10 = QPlatformDrag::currentDrag();
      this_02 = pQVar9;
      if (lVar10 != 0) goto LAB_004ded42;
    }
    bVar3 = tryFixup(this_02,(QWidget *)object);
    if (bVar3) {
      QAbstractItemDelegate::commitData(this_00,(QWidget *)object);
    }
    if (*(short *)(event + 8) == 9) {
      pQVar8 = *(QWidget **)(*(long *)(object + 8) + 0x10);
      bVar3 = QWidget::hasFocus((QWidget *)object);
      if (pQVar8 != (QWidget *)0x0 && !bVar3) {
        iVar5 = QFocusEvent::reason();
        bVar3 = false;
        QAbstractItemDelegate::closeEditor(this_00,(QWidget *)object,NoHint);
        if (iVar5 != 3) goto LAB_004ded44;
        QWidget::setFocus(pQVar8);
        goto LAB_004ded42;
      }
    }
    bVar3 = false;
    _t2 = NoHint;
LAB_004defa8:
    QAbstractItemDelegate::closeEditor(this_00,(QWidget *)object,_t2);
  }
  else {
    if (sVar1 == 0x12) {
      if ((*(byte *)(*(long *)(object + 0x20) + 0xc) & 1) != 0) goto LAB_004dedf0;
    }
    else if (sVar1 == 6) {
      pQVar6 = QtPrivate::qobject_cast_helper<QTextEdit*,QObject>(object);
      if (pQVar6 == (QTextEdit *)0x0) {
        pQVar7 = QtPrivate::qobject_cast_helper<QPlainTextEdit*,QObject>(object);
        if (pQVar7 != (QPlainTextEdit *)0x0) goto LAB_004deda9;
      }
      else {
LAB_004deda9:
        if ((*(int *)(event + 0x40) + 0xfeffffffU < 5) &&
           ((0x1bU >> (*(int *)(event + 0x40) + 0xfeffffffU & 0x1f) & 1) != 0)) goto LAB_004ded42;
      }
      this_01 = event;
      cVar2 = QKeyEvent::matches((StandardKey)event);
      if (cVar2 != '\0') {
        QAbstractItemDelegate::closeEditor(this_00,(QWidget *)object,RevertModelCache);
        goto LAB_004dee3f;
      }
      iVar5 = *(int *)(event + 0x40);
      if (1 < iVar5 + 0xfefffffcU) {
        if (iVar5 == 0x1000002) {
          bVar4 = tryFixup((QAbstractItemDelegatePrivate *)this_01,(QWidget *)object);
          bVar3 = true;
          if (!bVar4) goto LAB_004ded44;
          QAbstractItemDelegate::commitData(this_00,(QWidget *)object);
          _t2 = EditPreviousItem;
        }
        else {
          if (iVar5 != 0x1000001) goto LAB_004ded42;
          bVar4 = tryFixup((QAbstractItemDelegatePrivate *)this_01,(QWidget *)object);
          bVar3 = true;
          if (!bVar4) goto LAB_004ded44;
          QAbstractItemDelegate::commitData(this_00,(QWidget *)object);
          _t2 = EditNextItem;
        }
        bVar3 = true;
        goto LAB_004defa8;
      }
      bVar4 = tryFixup((QAbstractItemDelegatePrivate *)this_01,(QWidget *)object);
      bVar3 = true;
      if (!bVar4) goto LAB_004ded44;
      local_50.metaType = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
      local_50.name = "QWidget*";
      local_50.data = &editor;
      QMetaObject::invokeMethod<QMetaMethodArgument>
                ((QObject *)this_00,"_q_commitDataAndCloseEditor",QueuedConnection,&local_50);
    }
LAB_004ded42:
    bVar3 = false;
  }
LAB_004ded44:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemDelegatePrivate::handleEditorEvent(QObject *object, QEvent *event)
{
    Q_Q(QAbstractItemDelegate);

    QWidget *editor = qobject_cast<QWidget*>(object);
    if (!editor)
        return false;
    if (event->type() == QEvent::KeyPress) {
        QKeyEvent *keyEvent = static_cast<QKeyEvent *>(event);
        if (editorHandlesKeyEvent(editor, keyEvent))
            return false;

#ifndef QT_NO_SHORTCUT
        if (keyEvent->matches(QKeySequence::Cancel)) {
            // don't commit data
            emit q->closeEditor(editor, QAbstractItemDelegate::RevertModelCache);
            return true;
        }
#endif

        switch (keyEvent->key()) {
        case Qt::Key_Tab:
            if (tryFixup(editor)) {
                emit q->commitData(editor);
                emit q->closeEditor(editor, QAbstractItemDelegate::EditNextItem);
            }
            return true;
        case Qt::Key_Backtab:
            if (tryFixup(editor)) {
                emit q->commitData(editor);
                emit q->closeEditor(editor, QAbstractItemDelegate::EditPreviousItem);
            }
            return true;
        case Qt::Key_Enter:
        case Qt::Key_Return:
            // We want the editor to be able to process the key press
            // before committing the data (e.g. so it can do
            // validation/fixup of the input).
            if (!tryFixup(editor))
                return true;

            QMetaObject::invokeMethod(q, "_q_commitDataAndCloseEditor",
                                      Qt::QueuedConnection, Q_ARG(QWidget*, editor));
            return false;
        default:
            return false;
        }
    } else if (event->type() == QEvent::FocusOut || (event->type() == QEvent::Hide && editor->isWindow())) {
        //the Hide event will take care of he editors that are in fact complete dialogs
        if (!editor->isActiveWindow() || (QApplication::focusWidget() != editor)) {
            QWidget *w = QApplication::focusWidget();
            while (w) { // don't worry about focus changes internally in the editor
                if (w == editor)
                    return false;
                w = w->parentWidget();
            }
#if QT_CONFIG(draganddrop)
            // The window may lose focus during an drag operation.
            // i.e when dragging involves the taskbar on Windows.
            QPlatformDrag *platformDrag = QGuiApplicationPrivate::instance()->platformIntegration()->drag();
            if (platformDrag && platformDrag->currentDrag()) {
                return false;
            }
#endif
            if (tryFixup(editor))
                emit q->commitData(editor);

            // If the application loses focus while editing, then the focus needs to go back
            // to the itemview when the editor closes. This ensures that when the application
            // is active again it will have the focus on the itemview as expected.
            QWidget *editorParent = editor->parentWidget();
            const bool manuallyFixFocus = (event->type() == QEvent::FocusOut) && !editor->hasFocus() &&
                    editorParent &&
                    (static_cast<QFocusEvent *>(event)->reason() == Qt::ActiveWindowFocusReason);
            emit q->closeEditor(editor, QAbstractItemDelegate::NoHint);
            if (manuallyFixFocus)
                editorParent->setFocus();
        }
#ifndef QT_NO_SHORTCUT
    } else if (event->type() == QEvent::ShortcutOverride) {
        if (static_cast<QKeyEvent*>(event)->matches(QKeySequence::Cancel)) {
            event->accept();
            return true;
        }
#endif
    }
    return false;
}